

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRefCount.cpp
# Opt level: O0

void testRefCount(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  TestObject *pTVar4;
  undefined1 local_58 [8];
  Ptr<TestObject> ptr2;
  Ptr<TestObject> ptr_1;
  Ptr<TestObject> ptr3;
  undefined1 local_18 [8];
  Ptr<TestObject> ptr;
  
  pTVar4 = (TestObject *)operator_new(0x10);
  testRefCount::TestObject::TestObject(pTVar4);
  RefCount::Ptr<testRefCount()::TestObject>::Ptr<testRefCount()::TestObject>
            ((Ptr<testRefCount()::TestObject> *)local_18,pTVar4);
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x13,"count == 1");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  RefCount::Ptr<TestObject>::~Ptr((Ptr<TestObject> *)local_18);
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x15,"count == 0");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  RefCount::Ptr<TestObject>::Ptr((Ptr<TestObject> *)&ptr_1.obj);
  pTVar4 = (TestObject *)operator_new(0x10);
  testRefCount::TestObject::TestObject(pTVar4);
  RefCount::Ptr<testRefCount()::TestObject>::Ptr<testRefCount()::TestObject>
            ((Ptr<testRefCount()::TestObject> *)&ptr2.obj,pTVar4);
  bVar2 = RefCount::Ptr<testRefCount()::TestObject>::operator!=
                    ((Ptr<testRefCount()::TestObject> *)&ptr2.obj,(Ptr<TestObject> *)&ptr_1.obj);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x1b,"ptr != ptr3");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  RefCount::Ptr<TestObject>::Ptr((Ptr<TestObject> *)local_58,(Ptr<TestObject> *)&ptr2.obj);
  bVar2 = RefCount::Ptr<testRefCount()::TestObject>::operator==
                    ((Ptr<testRefCount()::TestObject> *)&ptr2.obj,(Ptr<TestObject> *)local_58);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x1d,"ptr == ptr2");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  RefCount::Ptr<TestObject>::operator=((Ptr<TestObject> *)&ptr_1.obj,(Ptr<TestObject> *)local_58);
  bVar2 = RefCount::Ptr<testRefCount()::TestObject>::operator==
                    ((Ptr<testRefCount()::TestObject> *)&ptr2.obj,(Ptr<TestObject> *)&ptr_1.obj);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x1f,"ptr == ptr3");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x20,"count == 1");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  RefCount::Ptr<TestObject>::~Ptr((Ptr<TestObject> *)local_58);
  RefCount::Ptr<TestObject>::~Ptr((Ptr<TestObject> *)&ptr2.obj);
  RefCount::Ptr<TestObject>::~Ptr((Ptr<TestObject> *)&ptr_1.obj);
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x22,"count == 0");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void testRefCount()
{
  static int count = 0;

  class TestObject : public RefCount::Object
  {
  public:
    TestObject() {++count;}
    ~TestObject() {--count;}
  };

  // test construction and destruction
  {
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

  // test copy constructor
  {
    RefCount::Ptr<TestObject> ptr3;
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(ptr != ptr3);
    RefCount::Ptr<TestObject> ptr2(ptr);
    ASSERT(ptr == ptr2);
    ptr3 = ptr2;
    ASSERT(ptr == ptr3);
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

}